

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

int __thiscall ON_wString::Replace(ON_wString *this,wchar_t *token1,wchar_t *token2)

{
  ON_wString *this_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  wchar_t *pwVar5;
  ON_Internal_Empty_wString *pOVar6;
  ulong uVar7;
  ulong uVar8;
  wchar_t *pwVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int i;
  size_t local_80;
  size_t local_78;
  int local_70;
  int len;
  ON_wString *local_68;
  wchar_t *local_60;
  ON_SimpleArray<int> n;
  
  iVar11 = 0;
  if ((token1 != (wchar_t *)0x0) && (*token1 != L'\0')) {
    pwVar5 = L"";
    if (token2 != (wchar_t *)0x0) {
      pwVar5 = token2;
    }
    sVar4 = wcslen(token1);
    uVar3 = (uint)sVar4;
    iVar11 = 0;
    if (0 < (int)uVar3) {
      local_80 = wcslen(pwVar5);
      pOVar6 = (ON_Internal_Empty_wString *)(this->m_s + -3);
      if (this->m_s == (wchar_t *)0x0) {
        pOVar6 = &empty_wstring;
      }
      iVar13 = (pOVar6->header).string_length;
      if (iVar13 < (int)uVar3) {
        iVar11 = 0;
      }
      else {
        len = iVar13;
        local_60 = pwVar5;
        ON_SimpleArray<int>::ON_SimpleArray(&n,0x20);
        pwVar5 = this->m_s;
        i = 0;
        local_78 = sVar4;
        local_68 = this;
        while (this_00 = local_68, iVar11 = i, i <= (int)(iVar13 - uVar3)) {
          iVar1 = wcsncmp(pwVar5,token1,(ulong)(uVar3 & 0x7fffffff));
          if (iVar1 == 0) {
            ON_SimpleArray<int>::Append(&n,&i);
            i = i + (int)local_78;
            pwVar5 = pwVar5 + (uVar3 & 0x7fffffff);
          }
          else {
            pwVar5 = pwVar5 + 1;
            i = iVar11 + 1;
          }
        }
        uVar15 = (ulong)(uint)n.m_count;
        iVar12 = (int)local_78;
        iVar1 = ((int)local_80 - iVar12) * n.m_count + iVar13;
        iVar11 = n.m_count;
        if (iVar1 == 0) {
          Destroy(local_68);
        }
        else {
          CopyArray(local_68);
          iVar2 = iVar13;
          if (iVar13 < iVar1) {
            iVar2 = iVar1;
          }
          pwVar5 = ReserveArray(this_00,(long)iVar2);
          if (pwVar5 == (wchar_t *)0x0) {
            iVar11 = 0;
          }
          else {
            local_70 = iVar1;
            if (iVar12 < (int)local_80) {
              uVar7 = 0;
              uVar8 = 0;
              if (0 < n.m_count) {
                uVar8 = (ulong)(uint)n.m_count;
              }
              for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
                n.m_a[uVar7] = n.m_a[uVar7] + iVar12;
              }
              uVar7 = local_80 & 0xffffffff;
              local_80 = (size_t)(uint)-(int)local_80;
              while (0 < (int)uVar15) {
                uVar15 = uVar15 - 1;
                iVar2 = n.m_a[uVar15];
                pwVar9 = this_00->m_s;
                lVar10 = (long)iVar1;
                iVar1 = (int)local_80 + iVar1;
                pwVar5 = pwVar9 + lVar10;
                lVar10 = (long)iVar13;
                iVar13 = iVar13 - iVar12;
                for (; pwVar5 = pwVar5 + -1, iVar2 < lVar10; lVar10 = lVar10 + -1) {
                  *pwVar5 = pwVar9[lVar10 + -1];
                  iVar1 = iVar1 + -1;
                  iVar13 = iVar13 + -1;
                }
                memcpy(this_00->m_s + iVar1,local_60,uVar7 << 2);
              }
            }
            else {
              uVar8 = (ulong)(uint)*n.m_a;
              ON_SimpleArray<int>::Append(&n,&len);
              uVar3 = (uint)local_80;
              uVar14 = 0;
              uVar7 = 0;
              uVar15 = uVar8;
              if (0 < n.m_count) {
                uVar7 = (ulong)(uint)n.m_count;
              }
              while (uVar14 != uVar7) {
                pwVar5 = this_00->m_s;
                if (0 < (int)uVar3) {
                  memcpy(pwVar5 + (int)uVar8,local_60,(ulong)(uVar3 & 0x7fffffff) << 2);
                  uVar8 = (ulong)((int)uVar8 + uVar3);
                  pwVar5 = this_00->m_s;
                }
                iVar13 = n.m_a[uVar14 + 1];
                uVar14 = uVar14 + 1;
                pwVar9 = pwVar5 + (int)uVar8;
                for (uVar15 = (ulong)((int)uVar15 + (int)local_78); (long)uVar15 < (long)iVar13;
                    uVar15 = uVar15 + 1) {
                  *pwVar9 = pwVar5[uVar15];
                  uVar8 = (ulong)((int)uVar8 + 1);
                  pwVar9 = pwVar9 + 1;
                }
              }
            }
            pwVar5 = this_00->m_s;
            pOVar6 = (ON_Internal_Empty_wString *)(pwVar5 + -3);
            if (pwVar5 == (wchar_t *)0x0) {
              pOVar6 = &empty_wstring;
            }
            (pOVar6->header).string_length = local_70;
            pwVar5[local_70] = L'\0';
          }
        }
        ON_SimpleArray<int>::~ON_SimpleArray(&n);
      }
    }
  }
  return iVar11;
}

Assistant:

int ON_wString::Replace( const wchar_t* token1, const wchar_t* token2 )
{
  int count = 0;

  if ( 0 != token1 && 0 != token1[0] )
  {
    if ( 0 == token2 )
      token2 = L"";
    const int len1 = (int)wcslen(token1);
    if ( len1 > 0 )
    {
      const int len2 = (int)wcslen(token2);
      int len = Length();
      if ( len >= len1 )
      {
        // in-place
        ON_SimpleArray<int> n(32);
        const wchar_t* s = m_s;
        int i;
        for ( i = 0; i <= len-len1; /*empty*/ )
        {
          if ( wcsncmp(s,token1,len1) )
          {
            s++;
            i++;
          }
          else
          {
            n.Append(i);
            i += len1;
            s += len1;
          }
        }

        count = n.Count();

        // reserve array space - must be done even when len2 <= len1
        // so that shared arrays are not corrupted.
        const int newlen = len + (count*(len2-len1));
        if ( 0 == newlen )
        {
          Destroy();
          return count;
        }

        CopyArray();

        // 24 August 2006 Dale Lear
        //    This used to say
        //       ReserveArray(newlen);
        //    but when newlen < len and the string had multiple
        //    references, the ReserveArray(newlen) call truncated
        //    the input array.
        if (nullptr == ReserveArray((newlen < len) ? len : newlen))
          return 0;

        int i0, i1, ni, j;

        if ( len2 > len1 )
        {
          // copy from back to front
          i1 = newlen;
          i0 = len;
          for ( ni =0; ni < count; ni++ )
            n[ni] = n[ni] + len1;
          for ( ni = count-1; ni >= 0; ni-- )
          {
            j = n[ni];
            while ( i0 > j )
            {
              i0--;
              i1--;
              m_s[i1] = m_s[i0];
            }
            i1 -= len2;
            i0 -= len1;
            memcpy(&m_s[i1],token2,len2*sizeof(m_s[0]));
          }
        }
        else
        {
          // copy from front to back
          i0 = i1 = n[0];
          n.Append(len);
          for ( ni = 0; ni < count; ni++ )
          {
            if ( len2 > 0 )
            {
              memcpy(&m_s[i1],token2,len2*sizeof(m_s[0]));
              i1 += len2;
            }
            i0 += len1;
            j = n[ni+1];
            while ( i0 < j )
            {
              m_s[i1++] = m_s[i0++];
            }
          }
        }
        Header()->string_length = newlen;
        m_s[newlen] = 0;
      }
    }
  }

  return count;
}